

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.hpp
# Opt level: O0

void __thiscall Tiles::unpack(Tiles *this,State *dst,PackedState s)

{
  ulong uVar1;
  uint uVar2;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int t;
  int i;
  int local_1c;
  ulong local_8;
  
  *(undefined1 *)(in_RSI + 0x11) = 0;
  *(undefined1 *)(in_RSI + 0x10) = 0xff;
  local_8 = in_RDX;
  for (local_1c = 0xf; -1 < local_1c; local_1c = local_1c + -1) {
    uVar1 = local_8 & 0xf;
    uVar2 = (uint)local_8 & 0xf;
    local_8 = local_8 >> 4;
    *(char *)(in_RSI + local_1c) = (char)uVar2;
    if (uVar1 == 0) {
      *(char *)(in_RSI + 0x10) = (char)local_1c;
    }
    else {
      *(char *)(in_RSI + 0x11) =
           *(char *)(in_RSI + 0x11) +
           (char)*(undefined4 *)(in_RDI + 0x40 + (long)(int)uVar2 * 0x40 + (long)local_1c * 4);
    }
  }
  if (-1 < *(char *)(in_RSI + 0x10)) {
    return;
  }
  __assert_fail("dst.blank >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/tiles.hpp"
                ,0x93,"void Tiles::unpack(State &, PackedState) const");
}

Assistant:

void unpack(State &dst, PackedState s) const {
        dst.h = 0;
        dst.blank = -1;
        for (int i = Ntiles - 1; i >= 0; i--) {
            int t = s.word & 0xF;
            s.word >>= 4;
            dst.tiles[i] = t;
            if (t == 0)
                dst.blank = i;
            else
                dst.h += md[t][i];
        }
        assert (dst.blank >= 0);
    }